

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

mir_size_t type_size(c2m_ctx_t c2m_ctx,type *type)

{
  ulong uVar1;
  mir_size_t mVar2;
  ulong uVar3;
  
  mVar2 = raw_type_size(c2m_ctx,type);
  uVar3 = (ulong)type->align;
  if (uVar3 != 0) {
    uVar1 = (mVar2 - 1) + uVar3;
    mVar2 = uVar1 - uVar1 % uVar3;
  }
  return mVar2;
}

Assistant:

static mir_size_t type_size (c2m_ctx_t c2m_ctx, struct type *type) {
  mir_size_t size = raw_type_size (c2m_ctx, type);

  return type->align == 0 ? size : round_size (size, type->align);
}